

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O2

string * __thiscall
toml::detail::character::name_abi_cxx11_(string *__return_storage_ptr__,character *this)

{
  int in_EDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  show_char_abi_cxx11_(&local_30,(detail *)(ulong)this->value_,in_EDX);
  std::operator+(&local_50,"character{",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_30);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,&local_50,"}");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE std::string character::name() const
{
    return "character{" + show_char(value_) + "}";
}